

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O1

string * gmlc::networking::getLocalExternalAddressV4_abi_cxx11_(void)

{
  undefined8 *puVar1;
  size_t __n;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  string *psVar5;
  _Alloc_hider __s2;
  size_type sVar6;
  undefined8 uVar7;
  int iVar8;
  size_type sVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interface_addresses;
  error_code ec;
  shared_ptr<gmlc::networking::AsioContextManager> srv;
  query query;
  resolver resolver;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_138;
  error_code local_128;
  undefined1 local_118 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [2];
  __native_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor> local_80;
  
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  local_e8[0]._M_allocated_capacity = 0;
  local_e8[0]._M_local_buf[8] = '\0';
  local_118._40_8_ = local_e8[0]._M_local_buf + 8;
  AsioContextManager::getContextPointer
            ((AsioContextManager *)local_118,(string *)(local_118 + 0x28));
  if ((char *)local_118._40_8_ != local_e8[0]._M_local_buf + 8) {
    operator_delete((void *)local_118._40_8_,
                    CONCAT71(local_e8[0]._9_7_,local_e8[0]._M_local_buf[8]) + 1);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::io_object_impl<asio::io_context>(&local_80,0,0,*(io_context **)(local_118._0_8_ + 0x40));
  local_128._M_value = 2;
  asio::ip::host_name_abi_cxx11_();
  local_148._0_8_ = &aStack_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"");
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)(local_118 + 0x28),(protocol_type *)&local_128,
             &local_198,(string *)local_148,address_configured);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._0_8_ != &aStack_138) {
    operator_delete((void *)local_148._0_8_,aStack_138._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,
                    CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                             local_198.field_2._M_local_buf[0]) + 1);
  }
  local_128._M_value = 0;
  local_128._M_cat = (error_category *)std::_V2::system_category();
  asio::detail::resolver_service<asio::ip::tcp>::resolve
            ((results_type *)&local_198,local_80.service_,&local_80.implementation_,
             (query_type *)(local_118 + 0x28),&local_128);
  local_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length;
  iVar8 = extraout_EDX;
  if (local_128._M_value == 0) {
    sVar9 = *(size_type *)local_198._M_dataplus._M_p;
    lVar11 = CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                      local_198.field_2._M_local_buf[0]) * 0x60;
    puVar1 = (undefined8 *)(sVar9 + 8 + lVar11);
    local_118._16_8_ = *puVar1;
    local_118._24_8_ = puVar1[1];
    if (*(short *)(sVar9 + lVar11) == 2) {
      aStack_138._8_4_ = 0;
      local_148._0_8_ = (ulong)*(uint *)(sVar9 + 4 + lVar11) << 0x20;
      local_148._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      aStack_138._M_allocated_capacity = 0;
    }
    else {
      aStack_138._8_4_ = *(undefined4 *)(sVar9 + 0x18 + lVar11);
      local_148._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
      local_148._8_8_ = local_118._16_8_;
      aStack_138._M_allocated_capacity = local_118._24_8_;
    }
    asio::ip::address::to_string_abi_cxx11_(&local_198,(address *)local_148);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_170,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198);
    iVar8 = extraout_EDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                               local_198.field_2._M_local_buf[0]) + 1);
      iVar8 = extraout_EDX_01;
    }
  }
  netif::getInterfaceAddresses_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_148,(netif *)0x2,iVar8);
  uVar7 = local_148._8_8_;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._0_8_;
  this = local_150;
  sVar6 = local_170._M_string_length;
  __s2._M_p = local_170._M_dataplus._M_p;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._0_8_;
  if (local_148._0_8_ == local_148._8_8_) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if (local_170._M_string_length == 0) {
      std::__cxx11::string::_M_construct<char_const*>();
    }
    else {
LAB_003d09db:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p == &local_170.field_2) {
        (in_RDI->field_2)._M_allocated_capacity =
             CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                      local_170.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_170.field_2._8_8_;
      }
      else {
        (in_RDI->_M_dataplus)._M_p = local_170._M_dataplus._M_p;
        (in_RDI->field_2)._M_allocated_capacity =
             CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                      local_170.field_2._M_local_buf[0]);
      }
      in_RDI->_M_string_length = sVar6;
      local_170._M_string_length = 0;
      local_170.field_2._M_local_buf[0] = '\0';
      this = local_150;
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    }
  }
  else {
    do {
      __n = *(size_t *)(paVar10->_M_local_buf + 8);
      if ((__n == sVar6) &&
         ((__n == 0 ||
          (iVar8 = bcmp((void *)paVar10->_M_allocated_capacity,__s2._M_p,__n), iVar8 == 0)))) {
        (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
        goto LAB_003d09db;
      }
      paVar10 = paVar10 + 2;
    } while (paVar10 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)uVar7);
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    local_198._M_string_length = 0;
    local_198.field_2._M_local_buf[0] = '\0';
    if (paVar12 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar7) {
      paVar10 = &in_RDI->field_2;
      do {
        (in_RDI->_M_dataplus)._M_p = (pointer)paVar10;
        std::__cxx11::string::_M_construct<char*>();
        bVar3 = false;
        sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                rfind(in_RDI,"127.",0,4);
        if (sVar9 == 0) {
          bVar4 = true;
        }
        else {
          bVar4 = false;
          sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  rfind(in_RDI,"169.254.",0,8);
          if (sVar9 == 0) {
            bVar4 = true;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_198,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI)
              ;
            }
            bVar3 = false;
          }
          else {
            bVar3 = true;
          }
        }
        if ((!bVar3) &&
           (pcVar2 = (in_RDI->_M_dataplus)._M_p,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar2 != paVar10)) {
          operator_delete(pcVar2,paVar10->_M_allocated_capacity + 1);
        }
        if (!bVar4) goto LAB_003d0ac0;
        paVar12 = paVar12 + 2;
      } while (paVar12 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)uVar7);
    }
    paVar12 = &in_RDI->field_2;
    (in_RDI->_M_dataplus)._M_p = (pointer)paVar12;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&local_170.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p == paVar10) {
        paVar12->_M_allocated_capacity =
             CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                      local_170.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_170.field_2._8_8_;
      }
      else {
        (in_RDI->_M_dataplus)._M_p = local_170._M_dataplus._M_p;
        (in_RDI->field_2)._M_allocated_capacity =
             CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                      local_170.field_2._M_local_buf[0]);
      }
      psVar5 = (string *)&local_170;
      in_RDI->_M_string_length = local_170._M_string_length;
      local_170._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      paVar10 = &local_198.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p == paVar10) {
        paVar12->_M_allocated_capacity =
             CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                      local_198.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_198.field_2._8_8_;
      }
      else {
        (in_RDI->_M_dataplus)._M_p = local_198._M_dataplus._M_p;
        (in_RDI->field_2)._M_allocated_capacity =
             CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                      local_198.field_2._M_local_buf[0]);
      }
      psVar5 = &local_198;
      in_RDI->_M_string_length = local_198._M_string_length;
      local_198._M_dataplus._M_p = (pointer)paVar10;
    }
    psVar5->_M_string_length = 0;
    paVar10->_M_local_buf[0] = '\0';
LAB_003d0ac0:
    this = local_150;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                               local_198.field_2._M_local_buf[0]) + 1);
      this = local_150;
    }
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_148);
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.__data.__list.__next != &local_90) {
    operator_delete(local_c0.__data.__list.__next,(ulong)(local_90._M_allocated_capacity + 1));
  }
  if ((char *)local_c0.__align != local_c0.__size + 0x10) {
    operator_delete((void *)local_c0.__align,local_c0._16_8_ + 1);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::~io_object_impl(&local_80);
  if ((element_type *)local_118._8_8_ != (element_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,
                    CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                             local_170.field_2._M_local_buf[0]) + 1);
  }
  return in_RDI;
}

Assistant:

std::string getLocalExternalAddressV4()
{
    std::string resolved_address;
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    auto srv = AsioContextManager::getContextPointer();

    asio::ip::tcp::resolver resolver(srv->getBaseContext());
    asio::ip::tcp::resolver::query query(
        asio::ip::tcp::v4(), asio::ip::host_name(), "");
    std::error_code ec;
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query, ec);

    if (!ec) {
        asio::ip::tcp::endpoint endpoint = *it;
        resolved_address = endpoint.address().to_string();
    }
#endif
    auto interface_addresses = gmlc::netif::getInterfaceAddressesV4();

    // Return the resolved address if no interface addresses were found
    if (interface_addresses.empty()) {
        if (resolved_address.empty()) {
            return "0.0.0.0";
        }
        return resolved_address;
    }

    // Use the resolved address if it matches one of the interface addresses
    for (const auto& addr : interface_addresses) {
        if (addr == resolved_address) {
            return resolved_address;
        }
    }

    // Pick an interface that isn't an IPv4 loopback address, 127.0.0.1/8
    // or an IPv4 link-local address, 169.254.0.0/16
    std::string link_local_addr;
    for (auto addr : interface_addresses) {
        if (addr.rfind("127.", 0) != 0) {
            if (addr.rfind("169.254.", 0) != 0) {
                return addr;
            }
            if (link_local_addr.empty()) {
                link_local_addr = addr;
            }
        }
    }

    // Return a link-local address since no alternatives were found
    if (!link_local_addr.empty()) {
        return link_local_addr;
    }

    // Very likely that any address returned at this point won't be a working
    // external address
    return resolved_address;
}